

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  TestingPortal *pTVar5;
  undefined8 *puVar6;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  void *__ptr;
  long *plVar10;
  undefined8 uVar11;
  int size;
  int extraout_EDX;
  int size_00;
  int extraout_EDX_00;
  int size_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *pcVar12;
  int i;
  long lVar13;
  int **ppiVar14;
  bool bVar15;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pTVar5 = tcmalloc::TestingPortal::Get();
  puVar6 = (undefined8 *)(**(code **)(*(long *)pTVar5 + 0x28))(pTVar5);
  *puVar6 = 0x80000;
  if (2 < argc) {
LAB_00101789:
    printf("USAGE: %s [number of children to fork]\n",*argv);
    exit(0);
  }
  iVar1 = 0;
  if (argc == 2) {
    if (*argv[1] == '-') goto LAB_00101789;
    iVar1 = atoi(argv[1]);
  }
  iVar2 = IsHeapProfilerRunning();
  if (iVar2 == 0) {
    pcVar7 = getenv("TMPDIR");
    pcVar12 = "/tmp";
    if (pcVar7 != (char *)0x0) {
      pcVar12 = pcVar7;
    }
    mkdir(pcVar12,0x1ed);
    local_70[0] = local_60;
    sVar8 = strlen(pcVar12);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar12,pcVar12 + sVar8);
    plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_40 = *plVar10;
      uStack_38 = (undefined4)plVar9[3];
      uStack_34 = *(undefined4 *)((long)plVar9 + 0x1c);
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar10;
      local_50 = (long *)*plVar9;
    }
    local_48 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    HeapProfilerStart(local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    iVar2 = IsHeapProfilerRunning();
    if (iVar2 != 0) {
      Allocate(0x28,100,size);
      lVar13 = 0;
      do {
        if (*(void **)((long)g_array + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)g_array + lVar13));
        }
        *(undefined8 *)((long)g_array + lVar13) = 0;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x140);
      HeapProfilerStop();
      iVar2 = IsHeapProfilerRunning();
      if (iVar2 != 0) {
        pcVar12 = "Check failed: !IsHeapProfilerRunning()\n";
        uVar11 = 0x27;
        goto LAB_001017c5;
      }
      goto LAB_00101486;
    }
  }
  else {
LAB_00101486:
    iVar3 = IsHeapProfilerRunning();
    iVar2 = extraout_EDX;
    if (iVar3 != 0) {
LAB_001015bc:
      Allocate(0x28,100,iVar2);
      lVar13 = 0;
      ppiVar14 = g_array;
      uVar11 = extraout_RDX;
      do {
        if (*(void **)((long)g_array + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)g_array + lVar13));
          uVar11 = extraout_RDX_00;
        }
        *(undefined8 *)((long)g_array + lVar13) = 0;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x140);
      Allocate(0x28,100,(int)uVar11);
      Allocate(0x28,100,size_01);
      Allocate2(0x28,400,1000);
      Allocate2(400,1000,10000);
      uVar11 = extraout_RDX_01;
      iVar2 = 1;
      do {
        if (*ppiVar14 != (int *)0x0) {
          operator_delete__(*ppiVar14);
          uVar11 = extraout_RDX_02;
        }
        *ppiVar14 = (int *)0x0;
        ppiVar14 = ppiVar14 + 1;
        bVar15 = iVar2 != 1000;
        iVar2 = iVar2 + 1;
      } while (bVar15);
      Allocate(100,100000,(int)uVar11);
      lVar13 = 0;
      do {
        if (*(void **)((long)g_array + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)g_array + lVar13));
        }
        *(undefined8 *)((long)g_array + lVar13) = 0;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x50);
      lVar13 = 0;
      do {
        if (g_array[lVar13 + 10] != (int *)0x0) {
          operator_delete__(g_array[lVar13 + 10]);
        }
        g_array[lVar13 + 10] = (int *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10);
      lVar13 = 0;
      do {
        if (g_array[lVar13 + 0x5a] != (int *)0x0) {
          operator_delete__(g_array[lVar13 + 0x5a]);
        }
        g_array[lVar13 + 0x5a] = (int *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10);
      lVar13 = 0x14;
      do {
        if (g_array[lVar13] != (int *)0x0) {
          operator_delete__(g_array[lVar13]);
        }
        g_array[lVar13] = (int *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x5a);
      if (0 < iVar1) {
        iVar1 = iVar1 + 1;
        do {
          _Var4 = fork();
          if (_Var4 == 0) {
            iVar1 = execl(*argv,*argv,0);
            return iVar1;
          }
          if (_Var4 == -1) {
            puts("FORK failed!");
            return 1;
          }
          wait((void *)0x0);
          iVar1 = iVar1 + -1;
        } while (1 < iVar1);
      }
      puts("DONE.");
      return 0;
    }
    pcVar7 = getenv("TMPDIR");
    pcVar12 = "/tmp";
    if (pcVar7 != (char *)0x0) {
      pcVar12 = pcVar7;
    }
    mkdir(pcVar12,0x1ed);
    local_70[0] = local_60;
    sVar8 = strlen(pcVar12);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar12,pcVar12 + sVar8);
    plVar9 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_40 = *plVar10;
      uStack_38 = (undefined4)plVar9[3];
      uStack_34 = *(undefined4 *)((long)plVar9 + 0x1c);
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar10;
      local_50 = (long *)*plVar9;
    }
    local_48 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    HeapProfilerStart(local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    iVar2 = IsHeapProfilerRunning();
    if (iVar2 != 0) {
      Allocate(0x28,100,size_00);
      lVar13 = 0;
      do {
        if (*(void **)((long)g_array + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)g_array + lVar13));
        }
        *(undefined8 *)((long)g_array + lVar13) = 0;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x140);
      __ptr = (void *)GetHeapProfile();
      free(__ptr);
      HeapProfilerStop();
      iVar2 = extraout_EDX_00;
      goto LAB_001015bc;
    }
  }
  pcVar12 = "Check failed: IsHeapProfilerRunning()\n";
  uVar11 = 0x26;
LAB_001017c5:
  syscall(1,2,pcVar12,uVar11);
  abort();
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;

  if (argc > 2 || (argc == 2 && argv[1][0] == '-')) {
    printf("USAGE: %s [number of children to fork]\n", argv[0]);
    exit(0);
  }
  int num_forks = 0;
  if (argc == 2) {
    num_forks = atoi(argv[1]);
  }

  TestHeapProfilerStartStopIsRunning();
  TestDumpHeapProfiler();

  Allocate(0, 40, 100);
  Deallocate(0, 40);

  Allocate(0, 40, 100);
  Allocate(0, 40, 100);
  Allocate2(40, 400, 1000);
  Allocate2(400, 1000, 10000);
  Deallocate(0, 1000);

  Allocate(0, 100, 100000);
  Deallocate(0, 10);
  Deallocate(10, 20);
  Deallocate(90, 100);
  Deallocate(20, 90);

  while (num_forks-- > 0) {
    switch (fork()) {
      case -1:
        printf("FORK failed!\n");
        return 1;
      case 0:             // child
        return execl(argv[0], argv[0], nullptr);   // run child with no args
      default:
        wait(nullptr);       // we'll let the kids run one at a time
    }
  }

  printf("DONE.\n");

  return 0;
}